

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QLayout::replaceWidget(QLayout *this,QWidget *from,QWidget *to,FindChildOptions options)

{
  int iVar1;
  Int IVar2;
  QLayoutPrivate *pQVar3;
  long *plVar4;
  long lVar5;
  undefined4 in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  QLayoutItem *r;
  QLayoutItem *newitem;
  QLayoutItem *r_1;
  int u;
  QLayoutItem *item;
  int index;
  QLayoutPrivate *d;
  QWidget *in_stack_ffffffffffffff58;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QWidgetItem *in_stack_ffffffffffffff60;
  QWidget *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_54;
  int local_44;
  QLayoutItem *local_20;
  QFlagsStorageHelper<Qt::FindChildOption,_4> local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ECX;
  pQVar3 = d_func((QLayout *)0x33ee57);
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_20 = (QLayoutItem *)0x0;
  }
  else if (in_RSI == in_RDX) {
    local_20 = (QLayoutItem *)0x0;
  }
  else {
    local_44 = -1;
    for (local_54 = 0; iVar1 = (**(code **)(*in_RDI + 200))(), local_54 < iVar1;
        local_54 = local_54 + 1) {
      plVar4 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_54);
      if (plVar4 != (long *)0x0) {
        lVar5 = (**(code **)(*plVar4 + 0x68))();
        if (lVar5 == in_RSI) {
          local_44 = local_54;
          break;
        }
        lVar5 = (**(code **)(*plVar4 + 0x70))();
        bVar6 = false;
        if (lVar5 != 0) {
          local_10.super_QFlagsStorage<Qt::FindChildOption>.i =
               (QFlagsStorage<Qt::FindChildOption>)
               QFlags<Qt::FindChildOption>::operator&
                         ((QFlags<Qt::FindChildOption> *)in_stack_ffffffffffffff60,
                          (FindChildOption)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
          bVar6 = IVar2 != 0;
        }
        if (bVar6) {
          plVar4 = (long *)(**(code **)(*plVar4 + 0x70))();
          local_20 = (QLayoutItem *)(**(code **)(*plVar4 + 0xe0))(plVar4,in_RSI,in_RDX,local_c);
          if (local_20 != (QLayoutItem *)0x0) goto LAB_0033f095;
        }
      }
    }
    if (local_44 == -1) {
      local_20 = (QLayoutItem *)0x0;
    }
    else {
      addChildWidget((QLayout *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
      plVar4 = (long *)operator_new(0x18);
      QWidgetItem::QWidgetItem(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      alignment.i = (Int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
      QLayoutItem::alignment(&in_stack_ffffffffffffff60->super_QLayoutItem);
      QLayoutItem::setAlignment((QLayoutItem *)0x33f04a,(Alignment)alignment.i);
      local_20 = (QLayoutItem *)(**(code **)(*(long *)pQVar3 + 0x20))(pQVar3,local_44,plVar4);
      if ((local_20 == (QLayoutItem *)0x0) && (plVar4 != (long *)0x0)) {
        (**(code **)(*plVar4 + 8))();
      }
    }
  }
LAB_0033f095:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

QLayoutItem *QLayout::replaceWidget(QWidget *from, QWidget *to, Qt::FindChildOptions options)
{
    Q_D(QLayout);
    if (!from || !to)
        return nullptr;
    if (from == to)     // Do not return a QLayoutItem for \a from, since ownership still
        return nullptr; // belongs to the layout (since nothing was changed)

    int index = -1;
    QLayoutItem *item = nullptr;
    for (int u = 0; u < count(); ++u) {
        item = itemAt(u);
        if (!item)
            continue;

        if (item->widget() == from) {
            index = u;
            break;
        }

        if (item->layout() && (options & Qt::FindChildrenRecursively)) {
            QLayoutItem *r = item->layout()->replaceWidget(from, to, options);
            if (r)
                return r;
        }
    }
    if (index == -1)
        return nullptr;

    addChildWidget(to);
    QLayoutItem *newitem = new QWidgetItem(to);
    newitem->setAlignment(item->alignment());
    QLayoutItem *r = d->replaceAt(index, newitem);
    if (!r)
        delete newitem;
    return r;
}